

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkcell.c
# Opt level: O0

LispPTR N_OP_createcell(LispPTR tos)

{
  LispPTR LVar1;
  DLword *pDVar2;
  LispPTR *base;
  ulong uVar3;
  ulong uVar4;
  uint type;
  LispPTR newcell;
  DLword *lastptr;
  DLword *ptr;
  dtd *dtd68k;
  LispPTR tos_local;
  
  pDVar2 = DTDspace;
  if ((tos & 0xfff0000) == 0xe0000) {
    uVar3 = (ulong)((tos & 0xffff) << 4);
    uVar4 = (ulong)((tos & 0xffff) << 1);
    oldoldfree = oldfree;
    oldfree = *(LispPTR *)(DTDspace + uVar3 + uVar4 + 4);
    if (DTDspace[uVar3 + uVar4 + 2] == 0) {
      MachineState.errorexit = 1;
      dtd68k._4_4_ = 0xffffffff;
      MachineState.tosvalue = tos;
    }
    else {
      while (dtd68k._4_4_ = *(uint *)(pDVar2 + uVar3 + uVar4 + 4) & 0xfffffff, dtd68k._4_4_ == 0) {
        base = alloc_mdspage(pDVar2[uVar3 + uVar4 + 0x11]);
        LVar1 = initmdspage(base,pDVar2[uVar3 + uVar4 + 2],0);
        *(LispPTR *)(pDVar2 + uVar3 + uVar4 + 4) = LVar1;
        if ((*(uint *)(pDVar2 + uVar3 + uVar4 + 4) & 0x8000000) != 0) {
          error("bad entry on free chain.");
        }
      }
      lastptr = NativeAligned2FromLAddr(dtd68k._4_4_);
      if (*(uint *)lastptr == 0xe0001) {
        error("N_OP_createcell E0001 error");
      }
      *(uint *)(pDVar2 + uVar3 + uVar4 + 4) = *(uint *)lastptr & 0xfffffff;
      if ((*(uint *)(pDVar2 + uVar3 + uVar4 + 4) & 0x8000001) != 0) {
        error("bad entry on free chain.");
      }
      *(int *)(pDVar2 + uVar3 + uVar4 + 0xc) = *(int *)(pDVar2 + uVar3 + uVar4 + 0xc) + 1;
      pDVar2 = (DLword *)((long)lastptr + (long)(int)(uint)pDVar2[uVar3 + uVar4 + 2] * 2);
      for (; lastptr != pDVar2; lastptr = lastptr + 1) {
        *(undefined2 *)((ulong)lastptr ^ 2) = 0;
      }
      if (((*(ushort *)((ulong)(MDStypetbl + (dtd68k._4_4_ >> 9)) ^ 2) & 0x8000) == 0) &&
         (*GcDisabled_word != 0x4c)) {
        if (*Reclaim_cnt_word == 0) {
          rec_htfind(dtd68k._4_4_,1);
        }
        else {
          htfind(dtd68k._4_4_,1);
        }
      }
    }
  }
  else {
    MachineState.errorexit = 1;
    dtd68k._4_4_ = 0xffffffff;
    MachineState.tosvalue = tos;
  }
  return dtd68k._4_4_;
}

Assistant:

LispPTR N_OP_createcell(LispPTR tos) {
  struct dtd *dtd68k;
  DLword *ptr, *lastptr;
  LispPTR newcell;
  unsigned int type;

  if ((tos & SEGMASK) != S_POSITIVE) ERROR_EXIT(tos);
  type = tos & 0xffff;

#ifdef DTDDEBUG
  if (type == TYPE_LISTP) error("N_OP_createcell : Can't create Listp cell with CREATECELL");
  check_dtd_chain(type);
#endif

  dtd68k = (struct dtd *)GetDTD(type);

  oldoldfree = oldfree;
  oldfree = dtd68k->dtd_free;

  if (dtd68k->dtd_size == 0) ERROR_EXIT(tos);
/* error("OP_createcell : Attempt to create a cell not declared yet"); */

retry:
  if ((tos = newcell = ((dtd68k->dtd_free) & POINTERMASK)) != NIL) {
    ptr = (DLword *)NativeAligned2FromLAddr(newcell);
    if (917505 == *(LispPTR *)ptr) error("N_OP_createcell E0001 error");
    /* replace dtd_free with newcell's top DLword (it may keep next chain)*/
    dtd68k->dtd_free = (*((LispPTR *)ptr)) & POINTERMASK;
    if (dtd68k->dtd_free & 0x8000001) error("bad entry on free chain.");

    dtd68k->dtd_oldcnt++;

    /* clear 0  */
    for (lastptr = ptr + dtd68k->dtd_size; ptr != lastptr; ptr++) { GETWORD(ptr) = 0; }

    /*	 IncAllocCnt(1); */
    GCLOOKUP(tos, DELREF);
    return (tos);
  } else {
    dtd68k->dtd_free = initmdspage(alloc_mdspage(dtd68k->dtd_typeentry), dtd68k->dtd_size, NIL);
    if (dtd68k->dtd_free & 0x8000000) error("bad entry on free chain.");
    goto retry;
  }

}